

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcher.cpp
# Opt level: O2

cbtPersistentManifold * __thiscall
cbtCollisionDispatcher::getNewManifold
          (cbtCollisionDispatcher *this,cbtCollisionObject *body0,cbtCollisionObject *body1)

{
  undefined1 auVar1 [16];
  cbtPersistentManifold **ppcVar2;
  cbtPersistentManifold *this_00;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtPersistentManifold *manifold;
  float local_2c;
  
  if ((this->m_dispatcherFlags & 2) == 0) {
    ppcVar2 = (cbtPersistentManifold **)&gContactBreakingThreshold;
  }
  else {
    cVar3 = gContactBreakingThreshold;
    (*body0->m_collisionShape->_vptr_cbtCollisionShape[5])();
    manifold = (cbtPersistentManifold *)CONCAT44(manifold._4_4_,cVar3);
    cVar4 = gContactBreakingThreshold;
    (*body1->m_collisionShape->_vptr_cbtCollisionShape[5])();
    local_2c = cVar4;
    ppcVar2 = (cbtPersistentManifold **)&local_2c;
    if (cVar3 < cVar4) {
      ppcVar2 = &manifold;
    }
  }
  cVar3 = *(cbtScalar *)ppcVar2;
  auVar1 = vminss_avx(ZEXT416((uint)body0->m_contactProcessingThreshold),
                      ZEXT416((uint)body1->m_contactProcessingThreshold));
  this_00 = (cbtPersistentManifold *)
            cbtPoolAllocator::allocate(this->m_persistentManifoldPoolAllocator,0x3b0);
  if (this_00 == (cbtPersistentManifold *)0x0) {
    if ((this->m_dispatcherFlags & 4) != 0) {
      return (cbtPersistentManifold *)0x0;
    }
    this_00 = (cbtPersistentManifold *)cbtAlignedAllocInternal(0x3b0,0x10);
  }
  cbtPersistentManifold::cbtPersistentManifold(this_00,body0,body1,0,cVar3,auVar1._0_4_);
  this_00->m_index1a = (this->m_manifoldsPtr).m_size;
  manifold = this_00;
  cbtAlignedObjectArray<cbtPersistentManifold_*>::push_back(&this->m_manifoldsPtr,&manifold);
  return manifold;
}

Assistant:

cbtPersistentManifold* cbtCollisionDispatcher::getNewManifold(const cbtCollisionObject* body0, const cbtCollisionObject* body1)
{
	//cbtAssert(gNumManifold < 65535);

	//optional relative contact breaking threshold, turned on by default (use setDispatcherFlags to switch off feature for improved performance)

	cbtScalar contactBreakingThreshold = (m_dispatcherFlags & cbtCollisionDispatcher::CD_USE_RELATIVE_CONTACT_BREAKING_THRESHOLD) ? cbtMin(body0->getCollisionShape()->getContactBreakingThreshold(gContactBreakingThreshold), body1->getCollisionShape()->getContactBreakingThreshold(gContactBreakingThreshold))
																																: gContactBreakingThreshold;

	cbtScalar contactProcessingThreshold = cbtMin(body0->getContactProcessingThreshold(), body1->getContactProcessingThreshold());

	void* mem = m_persistentManifoldPoolAllocator->allocate(sizeof(cbtPersistentManifold));
	if (NULL == mem)
	{
		//we got a pool memory overflow, by default we fallback to dynamically allocate memory. If we require a contiguous contact pool then assert.
		if ((m_dispatcherFlags & CD_DISABLE_CONTACTPOOL_DYNAMIC_ALLOCATION) == 0)
		{
			mem = cbtAlignedAlloc(sizeof(cbtPersistentManifold), 16);
		}
		else
		{
			cbtAssert(0);
			//make sure to increase the m_defaultMaxPersistentManifoldPoolSize in the cbtDefaultCollisionConstructionInfo/cbtDefaultCollisionConfiguration
			return 0;
		}
	}
	cbtPersistentManifold* manifold = new (mem) cbtPersistentManifold(body0, body1, 0, contactBreakingThreshold, contactProcessingThreshold);
	manifold->m_index1a = m_manifoldsPtr.size();
	m_manifoldsPtr.push_back(manifold);

	return manifold;
}